

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_winograd.h
# Opt level: O3

void ncnn::conv3x3s1_winograd63_transform_kernel(Mat *kernel,Mat *AT,int inch,int outch,Option *opt)

{
  float fVar1;
  float fVar2;
  float fVar3;
  void *pvVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int *piVar7;
  uint max_kk;
  int iVar8;
  Mat *A;
  uint _c;
  uint max_ii;
  ulong uVar9;
  Mat *pMVar10;
  int kk;
  ulong uVar11;
  float *pfVar12;
  int m;
  long lVar13;
  float z7;
  float fVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  int TILE_K;
  int TILE_N;
  int TILE_M;
  uint local_130;
  uint local_e4;
  undefined8 local_e0;
  undefined1 local_d8 [12];
  float fStack_cc;
  size_t local_c8;
  float local_c0 [2];
  undefined8 local_b8;
  int local_b0;
  int local_ac;
  float local_a8 [4];
  size_t local_98;
  float afStack_90 [6];
  Mat local_78;
  
  get_optimal_tile_mnk
            (outch,0,inch,(int *)((long)&local_e0 + 4),(int *)&local_e0,(int *)&local_e4,
             opt->num_threads);
  _c = (int)(local_e0._4_4_ + outch + -1) / (int)local_e0._4_4_;
  local_78.cstep = 0;
  local_78.data = (void *)0x0;
  local_78.refcount._0_4_ = 0;
  local_78.refcount._4_4_ = 0;
  local_78.elemsize._0_4_ = 0;
  local_78.elemsize._4_4_ = 0;
  local_78.elempack = 0;
  local_78.allocator = (Allocator *)0x0;
  local_78.dims = 0;
  local_78.w = 0;
  local_78.h = 0;
  local_78.d = 0;
  local_78.c = 0;
  Mat::create(&local_78,local_e4 * local_e0._4_4_ * 0x40,1,opt->num_threads,4,(Allocator *)0x0);
  Mat::create(AT,local_e4 * local_e0._4_4_,0x40,(int)(local_e4 + inch + -1) / (int)local_e4,_c,4,
              (Allocator *)0x0);
  if (0 < (int)_c) {
    local_130 = 0;
    do {
      iVar8 = get_omp_thread_num();
      if (0 < inch) {
        A = (Mat *)((long)iVar8 * local_78.cstep *
                    CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize) +
                   (long)local_78.data);
        max_ii = outch - local_e0._4_4_ * local_130;
        if ((int)local_e0._4_4_ < (int)max_ii) {
          max_ii = local_e0._4_4_;
        }
        iVar8 = 0;
        do {
          max_kk = inch - iVar8;
          if ((int)local_e4 < inch - iVar8) {
            max_kk = local_e4;
          }
          if (0 < (int)max_ii) {
            pvVar4 = kernel->data;
            uVar9 = 0;
            pMVar10 = A;
            do {
              if (0 < (int)max_kk) {
                uVar11 = 0;
                do {
                  pfVar12 = (float *)((long)pvVar4 +
                                     (uVar11 + (long)iVar8) * 0x24 +
                                     (long)(int)((local_e0._4_4_ * local_130 + (int)uVar9) *
                                                inch * 9) * 4);
                  lVar13 = 0;
                  do {
                    fVar1 = *pfVar12;
                    fVar2 = pfVar12[1];
                    fVar3 = pfVar12[2];
                    *(float *)(local_d8 + lVar13 * 4) = fVar1;
                    (&fStack_cc)[lVar13] =
                         (fVar1 * -0.22222222 - fVar2 * 0.22222222) + fVar3 * -0.22222222;
                    local_c0[lVar13] =
                         fVar2 * 0.22222222 + fVar1 * -0.22222222 + fVar3 * -0.22222222;
                    *(float *)((long)&local_b8 + lVar13 * 4 + 4) =
                         fVar2 * 0.022222223 + fVar1 * 0.011111111 + fVar3 * 0.044444446;
                    local_a8[lVar13] =
                         (fVar1 * 0.011111111 - fVar2 * 0.022222223) + fVar3 * 0.044444446;
                    local_a8[lVar13 + 3] =
                         fVar2 * 0.011111111 + fVar1 * 0.022222223 + fVar3 * 0.0055555557;
                    afStack_90[lVar13] =
                         (fVar1 * 0.022222223 - fVar2 * 0.011111111) + fVar3 * 0.0055555557;
                    afStack_90[lVar13 + 3] = fVar3;
                    pfVar12 = pfVar12 + 3;
                    lVar13 = lVar13 + 1;
                  } while (lVar13 != 3);
                  lVar13 = 8;
                  do {
                    fVar1 = *(float *)(local_d8 + lVar13);
                    auVar15._8_8_ = 0;
                    auVar15._0_8_ = *(ulong *)((long)&local_e0 + lVar13);
                    auVar5 = vshufps_avx(auVar15,auVar15,0x14);
                    auVar16._0_4_ = auVar5._0_4_ * -0.22222222;
                    auVar16._4_4_ = auVar5._4_4_ * 0.22222222;
                    auVar16._8_4_ = auVar5._8_4_ * 0.022222223;
                    auVar16._12_4_ = auVar5._12_4_ * 0.011111111;
                    auVar5 = vhaddps_avx(auVar16,auVar16);
                    auVar6 = vshufps_avx(auVar16,auVar16,0xa5);
                    auVar6 = vsubps_avx(auVar16,auVar6);
                    auVar5 = vshufps_avx(auVar6,auVar5,0xcc);
                    auVar6 = vshufps_avx(auVar5,auVar5,0x78);
                    fVar14 = (float)*(ulong *)((long)&local_e0 + lVar13);
                    fVar2 = fVar14 * 0.022222223;
                    auVar5 = vmovshdup_avx(auVar15);
                    fVar3 = auVar5._0_4_ * 0.011111111;
                    *(float *)&pMVar10->data = fVar14;
                    *(float *)((long)&pMVar10->data + 4) = auVar6._0_4_ + fVar1 * -0.22222222;
                    *(float *)&pMVar10->refcount = auVar6._4_4_ + fVar1 * -0.22222222;
                    *(float *)((long)&pMVar10->refcount + 4) = auVar6._8_4_ + fVar1 * 0.044444446;
                    *(float *)&pMVar10->elemsize = auVar6._12_4_ + fVar1 * 0.044444446;
                    *(float *)((long)&pMVar10->elemsize + 4) = fVar3 + fVar2 + fVar1 * 0.0055555557;
                    pMVar10->elempack = (int)((fVar2 - fVar3) + fVar1 * 0.0055555557);
                    *(float *)&pMVar10->field_0x1c = fVar1;
                    pMVar10 = (Mat *)&pMVar10->allocator;
                    lVar13 = lVar13 + 0xc;
                  } while (lVar13 != 0x68);
                  uVar11 = uVar11 + 1;
                } while (uVar11 != max_kk);
              }
              uVar9 = uVar9 + 1;
            } while (uVar9 != max_ii);
          }
          local_ac = AT->w;
          local_c8 = AT->elemsize;
          local_a8[0] = (float)AT->h;
          local_c0[0] = (float)AT->elempack;
          local_b8 = AT->allocator;
          local_98 = (long)(int)local_a8[0] * (long)local_ac;
          local_d8._0_8_ =
               (long)AT->data +
               local_c8 * local_98 * (long)(iVar8 / (int)local_e4) +
               AT->cstep * (ulong)local_130 * local_c8;
          stack0xffffffffffffff30 = (int *)0x0;
          local_b0 = 2;
          local_a8[1] = 1.4013e-45;
          local_a8[2] = 1.4013e-45;
          pack_A_tile(A,(Mat *)local_d8,0x40,max_ii,max_kk);
          iVar8 = iVar8 + local_e4;
        } while (iVar8 < inch);
      }
      local_130 = local_130 + 1;
    } while (local_130 != _c);
  }
  piVar7 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
  if (piVar7 != (int *)0x0) {
    LOCK();
    *piVar7 = *piVar7 + -1;
    UNLOCK();
    if (*piVar7 == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        if (local_78.data != (void *)0x0) {
          free(local_78.data);
        }
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd63_transform_kernel(const Mat& kernel, Mat& AT, int inch, int outch, const Option& opt)
{
    const int M = outch;
    const int K = inch;
    const int B = 64;

    int TILE_M, TILE_N, TILE_K;
    get_optimal_tile_mnk(M, 0, K, TILE_M, TILE_N, TILE_K, opt.num_threads);

    const int nn_M = (M + TILE_M - 1) / TILE_M;

    Mat A_tileX(B * TILE_M * TILE_K, 1, opt.num_threads, 4u, (Allocator*)0);

    AT.create(TILE_K * TILE_M, B, (K + TILE_K - 1) / TILE_K, (M + TILE_M - 1) / TILE_M, 4u, (Allocator*)0);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int ppj = 0; ppj < nn_M; ppj++)
    {
        const int i = ppj * TILE_M;

        Mat A_tile = A_tileX.channel(get_omp_thread_num());

        for (int k = 0; k < K; k += TILE_K)
        {
            const int max_ii = std::min((M - i), TILE_M);
            const int max_kk = std::min((K - k), TILE_K);

            conv3x3s1_winograd63_transform_kernel_tile(kernel, A_tile, inch, i, max_ii, k, max_kk);

            Mat AT_tile = AT.channel(i / TILE_M).depth(k / TILE_K);

            pack_A_tile(A_tile, AT_tile, B, max_ii, max_kk);
        }
    }
}